

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_fog_vol.cxx
# Opt level: O1

void __thiscall read_fog_vol::operator()(read_fog_vol *this,fog_vol_data **_fog_vol,xr_reader *r)

{
  undefined8 *puVar1;
  uint uVar2;
  uint8_t *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  fog_vol_data *value;
  fmatrix *pfVar11;
  ulong uVar12;
  ulong uVar13;
  
  value = (fog_vol_data *)operator_new(0x70);
  (value->ltx)._M_dataplus._M_p = (pointer)&(value->ltx).field_2;
  (value->ltx)._M_string_length = 0;
  (value->ltx).field_2._M_local_buf[0] = '\0';
  value->particles = (fmatrix *)0x0;
  *_fog_vol = value;
  xray_re::xr_reader::r_s(r,(string *)value);
  puVar3 = (r->field_2).m_p;
  uVar4 = *(undefined8 *)puVar3;
  uVar5 = *(undefined8 *)(puVar3 + 8);
  uVar6 = *(undefined8 *)(puVar3 + 0x10);
  uVar7 = *(undefined8 *)(puVar3 + 0x18);
  uVar8 = *(undefined8 *)(puVar3 + 0x20);
  uVar9 = *(undefined8 *)(puVar3 + 0x28);
  uVar10 = *(undefined8 *)(puVar3 + 0x38);
  *(undefined8 *)((long)&(value->xform).field_0 + 0x30) = *(undefined8 *)(puVar3 + 0x30);
  *(undefined8 *)((long)&(value->xform).field_0 + 0x38) = uVar10;
  *(undefined8 *)((long)&(value->xform).field_0 + 0x20) = uVar8;
  *(undefined8 *)((long)&(value->xform).field_0 + 0x28) = uVar9;
  *(undefined8 *)((long)&(value->xform).field_0 + 0x10) = uVar6;
  *(undefined8 *)((long)&(value->xform).field_0 + 0x18) = uVar7;
  *(undefined8 *)&(value->xform).field_0 = uVar4;
  *(undefined8 *)((long)&(value->xform).field_0 + 8) = uVar5;
  (r->field_2).m_p = puVar3 + 0x44;
  uVar2 = *(uint *)(puVar3 + 0x40);
  value->num_particles = uVar2;
  if ((ulong)uVar2 != 0) {
    uVar13 = (ulong)uVar2 << 6;
    pfVar11 = (fmatrix *)operator_new__(uVar13);
    value->particles = pfVar11;
    uVar12 = 0;
    puVar3 = (r->field_2).m_p;
    do {
      uVar4 = *(undefined8 *)puVar3;
      uVar5 = *(undefined8 *)(puVar3 + 8);
      uVar6 = *(undefined8 *)(puVar3 + 0x10);
      uVar7 = *(undefined8 *)(puVar3 + 0x18);
      uVar8 = *(undefined8 *)(puVar3 + 0x20);
      uVar9 = *(undefined8 *)(puVar3 + 0x28);
      uVar10 = *(undefined8 *)(puVar3 + 0x38);
      puVar1 = (undefined8 *)((long)&pfVar11->field_0 + uVar12 + 0x30);
      *puVar1 = *(undefined8 *)(puVar3 + 0x30);
      puVar1[1] = uVar10;
      puVar1 = (undefined8 *)((long)&pfVar11->field_0 + uVar12 + 0x20);
      *puVar1 = uVar8;
      puVar1[1] = uVar9;
      puVar1 = (undefined8 *)((long)&pfVar11->field_0 + uVar12 + 0x10);
      *puVar1 = uVar6;
      puVar1[1] = uVar7;
      puVar1 = (undefined8 *)((long)&pfVar11->field_0 + uVar12);
      *puVar1 = uVar4;
      puVar1[1] = uVar5;
      (r->field_2).m_p = puVar3 + 0x40;
      uVar12 = uVar12 + 0x40;
      puVar3 = puVar3 + 0x40;
    } while (uVar13 != uVar12);
  }
  return;
}

Assistant:

void operator()(fog_vol_data*& _fog_vol, xr_reader& r) const {
	fog_vol_data* fog_vol = new fog_vol_data;
	_fog_vol = fog_vol;
	r.r_s(fog_vol->ltx);
	r.r(fog_vol->xform);
	if ((fog_vol->num_particles = r.r_u32())) {
		fog_vol->particles = new fmatrix[fog_vol->num_particles];
		r.r_cseq(fog_vol->num_particles, fog_vol->particles);
	}
}